

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

obj * some_armor(monst *victim)

{
  int iVar1;
  obj *local_58;
  obj *local_50;
  obj *local_48;
  obj *local_40;
  obj *local_38;
  obj *local_30;
  obj *local_28;
  obj *otmp;
  obj *otmph;
  monst *victim_local;
  
  if (victim == &youmonst) {
    local_28 = uarmc;
  }
  else {
    local_28 = which_armor(victim,2);
  }
  otmp = local_28;
  if (local_28 == (obj *)0x0) {
    if (victim == &youmonst) {
      local_30 = uarm;
    }
    else {
      local_30 = which_armor(victim,1);
    }
    otmp = local_30;
  }
  if (otmp == (obj *)0x0) {
    if (victim == &youmonst) {
      local_38 = uarmu;
    }
    else {
      local_38 = which_armor(victim,0x40);
    }
    otmp = local_38;
  }
  if (victim == &youmonst) {
    local_40 = uarmh;
  }
  else {
    local_40 = which_armor(victim,4);
  }
  if ((local_40 != (obj *)0x0) && ((otmp == (obj *)0x0 || (iVar1 = rn2(4), iVar1 == 0)))) {
    otmp = local_40;
  }
  if (victim == &youmonst) {
    local_48 = uarmg;
  }
  else {
    local_48 = which_armor(victim,0x10);
  }
  if ((local_48 != (obj *)0x0) && ((otmp == (obj *)0x0 || (iVar1 = rn2(4), iVar1 == 0)))) {
    otmp = local_48;
  }
  if (victim == &youmonst) {
    local_50 = uarmf;
  }
  else {
    local_50 = which_armor(victim,0x20);
  }
  if ((local_50 != (obj *)0x0) && ((otmp == (obj *)0x0 || (iVar1 = rn2(4), iVar1 == 0)))) {
    otmp = local_50;
  }
  if (victim == &youmonst) {
    local_58 = uarms;
  }
  else {
    local_58 = which_armor(victim,8);
  }
  if (local_58 != (obj *)0x0) {
    if ((otmp != (obj *)0x0) && (iVar1 = rn2(4), iVar1 != 0)) {
      return otmp;
    }
    otmp = local_58;
  }
  return otmp;
}

Assistant:

struct obj *some_armor(struct monst *victim)
{
	struct obj *otmph, *otmp;

	otmph = (victim == &youmonst) ? uarmc : which_armor(victim, W_ARMC);
	if (!otmph)
	    otmph = (victim == &youmonst) ? uarm : which_armor(victim, W_ARM);
	if (!otmph)
	    otmph = (victim == &youmonst) ? uarmu : which_armor(victim, W_ARMU);
	
	otmp = (victim == &youmonst) ? uarmh : which_armor(victim, W_ARMH);
	if (otmp && (!otmph || !rn2(4))) otmph = otmp;
	otmp = (victim == &youmonst) ? uarmg : which_armor(victim, W_ARMG);
	if (otmp && (!otmph || !rn2(4))) otmph = otmp;
	otmp = (victim == &youmonst) ? uarmf : which_armor(victim, W_ARMF);
	if (otmp && (!otmph || !rn2(4))) otmph = otmp;
	otmp = (victim == &youmonst) ? uarms : which_armor(victim, W_ARMS);
	if (otmp && (!otmph || !rn2(4))) otmph = otmp;
	return otmph;
}